

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

char * cast_node_set_to_string(lyxp_set *set,lyd_node *cur_node,lys_module *param_3,int options)

{
  lyxp_node_type lVar1;
  lyxp_set_attr *plVar2;
  lyd_node *node;
  undefined8 in_RAX;
  char *pcVar3;
  int fake_cont;
  lyxp_node_type local_24 [2];
  lyxp_node_type root_type;
  
  local_24[0] = (lyxp_node_type)((ulong)in_RAX >> 0x20);
  plVar2 = (set->val).attrs;
  lVar1 = plVar2->type;
  if (lVar1 == LYXP_NODE_ATTR) {
    moveto_get_root(cur_node,options,local_24);
    pcVar3 = strdup(plVar2->attr->value_str);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
      ly_log(param_3->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "cast_node_set_to_string");
    }
  }
  else {
    node = (lyd_node *)plVar2->attr;
    if (-1 < (char)node->validity) {
      moveto_get_root(cur_node,options,local_24);
      if (lVar1 - LYXP_NODE_ELEM < 2) {
        fake_cont = 0;
      }
      else {
        if (LYXP_NODE_ROOT_CONFIG < lVar1) {
          ly_log(param_3->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                 ,0x234);
          return (char *)0x0;
        }
        fake_cont = 1;
      }
      pcVar3 = cast_string_elem(node,param_3,fake_cont,local_24[0]);
      return pcVar3;
    }
    pcVar3 = (char *)0x0;
    ly_vlog(param_3->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,node,node->schema->name);
  }
  return pcVar3;
}

Assistant:

static char *
cast_node_set_to_string(struct lyxp_set *set, struct lyd_node *cur_node, struct lys_module *local_mod, int options)
{
    enum lyxp_node_type root_type;
    char *str;

    if ((set->val.nodes[0].type != LYXP_NODE_ATTR) && (set->val.nodes[0].node->validity & LYD_VAL_INUSE)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[0].node, set->val.nodes[0].node->schema->name);
        return NULL;
    }

    moveto_get_root(cur_node, options, &root_type);

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 1, root_type);
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 0, root_type);
    case LYXP_NODE_ATTR:
        str = strdup(set->val.attrs[0].attr->value_str);
        if (!str) {
            LOGMEM(local_mod->ctx);
        }
        return str;
    }

    LOGINT(local_mod->ctx);
    return NULL;
}